

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_set_bounds(nk_context *ctx,char *name,nk_rect bounds)

{
  nk_window *pnVar1;
  nk_window *win;
  char *name_local;
  nk_context *ctx_local;
  nk_rect bounds_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x40c1,
                  "void nk_window_set_bounds(struct nk_context *, const char *, struct nk_rect)");
  }
  if ((ctx != (nk_context *)0x0) && (pnVar1 = nk_window_find(ctx,name), pnVar1 != (nk_window *)0x0))
  {
    if (ctx->current == pnVar1) {
      __assert_fail("ctx->current != win && \"You cannot update a currently in procecss window\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x40c5,
                    "void nk_window_set_bounds(struct nk_context *, const char *, struct nk_rect)");
    }
    (pnVar1->bounds).x = (float)(int)bounds._0_8_;
    (pnVar1->bounds).y = (float)(int)((ulong)bounds._0_8_ >> 0x20);
    (pnVar1->bounds).w = (float)(int)bounds._8_8_;
    (pnVar1->bounds).h = (float)(int)((ulong)bounds._8_8_ >> 0x20);
  }
  return;
}

Assistant:

NK_API void
nk_window_set_bounds(struct nk_context *ctx,
    const char *name, struct nk_rect bounds)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;
    win = nk_window_find(ctx, name);
    if (!win) return;
    NK_ASSERT(ctx->current != win && "You cannot update a currently in procecss window");
    win->bounds = bounds;
}